

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

void ot::commissioner::CommissionerApp::MergeDataset
               (ActiveOperationalDataset *aDst,ActiveOperationalDataset *aSrc)

{
  byte *pbVar1;
  
  if ((short)aSrc->mPresentFlags < 0) {
    aDst->mActiveTimestamp = aSrc->mActiveTimestamp;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((aSrc->mPresentFlags & 0x4000) != 0) {
    aDst->mChannel = aSrc->mChannel;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if ((aSrc->mPresentFlags & 0x2000) != 0) {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::operator=(&aDst->mChannelMask,&aSrc->mChannelMask);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if ((aSrc->mPresentFlags & 0x1000) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mExtendedPanId,&aSrc->mExtendedPanId);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if ((aSrc->mPresentFlags & 0x800) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mMeshLocalPrefix,&aSrc->mMeshLocalPrefix);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((aSrc->mPresentFlags & 0x400) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mNetworkMasterKey,&aSrc->mNetworkMasterKey);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  if ((aSrc->mPresentFlags & 0x200) != 0) {
    std::__cxx11::string::_M_assign((string *)&aDst->mNetworkName);
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if ((aSrc->mPresentFlags & 0x100) != 0) {
    aDst->mPanId = aSrc->mPanId;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((aSrc->mPresentFlags & 0x80) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&aDst->mPSKc,&aSrc->mPSKc)
    ;
    *(byte *)&aDst->mPresentFlags = (byte)aDst->mPresentFlags | 0x80;
  }
  if ((aSrc->mPresentFlags & 0x40) != 0) {
    (aDst->mSecurityPolicy).mRotationTime = (aSrc->mSecurityPolicy).mRotationTime;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(aDst->mSecurityPolicy).mFlags,&(aSrc->mSecurityPolicy).mFlags);
    *(byte *)&aDst->mPresentFlags = (byte)aDst->mPresentFlags | 0x40;
  }
  return;
}

Assistant:

void CommissionerApp::MergeDataset(ActiveOperationalDataset &aDst, const ActiveOperationalDataset &aSrc)
{
#define SET_IF_PRESENT(name)                                          \
    if (aSrc.mPresentFlags & ActiveOperationalDataset::k##name##Bit)  \
    {                                                                 \
        aDst.m##name = aSrc.m##name;                                  \
        aDst.mPresentFlags |= ActiveOperationalDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(Channel);
    SET_IF_PRESENT(ChannelMask);
    SET_IF_PRESENT(ExtendedPanId);
    SET_IF_PRESENT(MeshLocalPrefix);
    SET_IF_PRESENT(NetworkMasterKey);
    SET_IF_PRESENT(NetworkName);
    SET_IF_PRESENT(PanId);
    SET_IF_PRESENT(PSKc);
    SET_IF_PRESENT(SecurityPolicy);

#undef SET_IF_PRESENT
}